

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void stbtt__v_prefilter(uchar *pixels,int w,int h,int stride_in_bytes,uint kernel_width)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  uchar buffer [8];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  lVar4 = (long)stride_in_bytes;
  iVar6 = 0;
  if (w < 1) {
    w = 0;
  }
  while( true ) {
    if (iVar6 == w) {
      return;
    }
    memset(buffer,0,(ulong)kernel_width);
    if (kernel_width - 2 < 4) break;
    uVar3 = 0;
    pbVar7 = pixels;
    for (uVar5 = 0; (long)uVar5 <= (long)(int)(h - kernel_width); uVar5 = uVar5 + 1) {
      bVar1 = *pbVar7;
      bVar2 = buffer[(uint)uVar5 & 7];
      buffer[kernel_width + (uint)uVar5 & 7] = bVar1;
      uVar3 = uVar3 + ((uint)bVar1 - (uint)bVar2);
      *pbVar7 = (byte)(uVar3 / kernel_width);
      pbVar7 = pbVar7 + lVar4;
    }
    pbVar7 = pixels + uVar5 * lVar4;
    for (uVar5 = uVar5 & 0xffffffff; (long)uVar5 < (long)h; uVar5 = uVar5 + 1) {
      uVar3 = uVar3 - buffer[(uint)uVar5 & 7];
      *pbVar7 = (byte)(uVar3 / kernel_width);
      pbVar7 = pbVar7 + lVar4;
    }
    pixels = pixels + 1;
    iVar6 = iVar6 + 1;
  }
  (*(code *)(&DAT_001505b4 + *(int *)(&DAT_001505b4 + (ulong)(kernel_width - 2) * 4)))();
  return;
}

Assistant:

static void stbtt__v_prefilter(unsigned char *pixels, int w, int h, int stride_in_bytes, unsigned int kernel_width)
{
unsigned char buffer[STBTT_MAX_OVERSAMPLE];
int safe_h = h - kernel_width;
int j;
STBTT_memset(buffer, 0, STBTT_MAX_OVERSAMPLE); /*  suppress bogus warning from VS2013 -analyze */
for (j=0; j < w; ++j) {
int i;
unsigned int total;
STBTT_memset(buffer, 0, kernel_width);

total = 0;

/*  make kernel_width a constant in common cases so compiler can optimize out the divide */
switch (kernel_width) {
case 2:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 2);
}
break;
case 3:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 3);
}
break;
case 4:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 4);
}
break;
case 5:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / 5);
}
break;
default:
for (i=0; i <= safe_h; ++i) {
total += pixels[i*stride_in_bytes] - buffer[i & STBTT__OVER_MASK];
buffer[(i+kernel_width) & STBTT__OVER_MASK] = pixels[i*stride_in_bytes];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}
break;
}

for (; i < h; ++i) {
STBTT_assert(pixels[i*stride_in_bytes] == 0);
total -= buffer[i & STBTT__OVER_MASK];
pixels[i*stride_in_bytes] = (unsigned char) (total / kernel_width);
}

pixels += 1;
}
}